

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O2

int parsenetrc(char *host,char **loginp,char **passwordp,char *netrcfile)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  char *pcVar6;
  bool bVar7;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  bool bVar12;
  dynbuf buf;
  
  pcVar1 = *loginp;
  pcVar2 = *passwordp;
  __stream = fopen64(netrcfile,"r");
  if (__stream == (FILE *)0x0) {
    return 1;
  }
  Curl_dyn_init(&buf,0x1000);
  uVar10 = 0;
  iVar5 = 1;
  bVar12 = false;
LAB_001438f1:
  if ((bVar12) || (iVar4 = Curl_get_line(&buf,(FILE *)__stream), iVar4 == 0)) {
LAB_00143cd6:
    Curl_dyn_free(&buf);
    fclose(__stream);
    return iVar5;
  }
  pcVar6 = Curl_dyn_ptr(&buf);
  uVar9 = (uint)uVar10;
  if (uVar9 == 3) {
    bVar12 = false;
    uVar9 = 0;
    if ((*pcVar6 != '\r') && (uVar10 = 3, *pcVar6 != '\n')) goto LAB_001438f1;
  }
  uVar10 = (ulong)uVar9;
  bVar12 = pcVar6 != (char *)0x0;
  if (bVar12) {
    for (; (cVar8 = *pcVar6, cVar8 == '\t' || (cVar8 == ' ')); pcVar6 = pcVar6 + 1) {
    }
    if ((cVar8 == '\0') || (cVar8 == '#')) goto LAB_00143ca2;
    if (cVar8 == '\"') {
      pcVar11 = pcVar6;
      bVar3 = false;
LAB_00143982:
      bVar7 = bVar3;
      pcVar11 = pcVar11 + 1;
      cVar8 = *pcVar11;
      if (cVar8 != '\0') {
        if (!bVar7) goto code_r0x0014399b;
        if (cVar8 == 't') {
          cVar8 = '\t';
        }
        else if (cVar8 == 'r') {
          cVar8 = '\r';
        }
        else if (cVar8 == 'n') {
          cVar8 = '\n';
        }
        bVar7 = false;
        goto LAB_001439cc;
      }
      *pcVar6 = '\0';
      iVar5 = -1;
      goto LAB_00143cd6;
    }
    while (((cVar8 != '\t' && (cVar8 != ' ')) && ((byte)(cVar8 - 0xeU) < 0xfc))) {
      pcVar11 = pcVar6 + 1;
      pcVar6 = pcVar6 + 1;
      cVar8 = *pcVar11;
    }
LAB_001439f4:
    *pcVar6 = '\0';
    if (((pcVar1 == (char *)0x0) || (pcVar2 == (char *)0x0 || *pcVar1 == '\0')) || (*pcVar2 == '\0')
       ) {
      iVar5 = (*(code *)(&DAT_00170afc + *(int *)(&DAT_00170afc + uVar10 * 4)))();
      return iVar5;
    }
  }
  else {
LAB_00143ca2:
    bVar12 = false;
  }
  goto LAB_001438f1;
code_r0x0014399b:
  bVar3 = true;
  if (cVar8 != '\\') {
    if (cVar8 != '\"') {
LAB_001439cc:
      *pcVar6 = cVar8;
      pcVar6 = pcVar6 + 1;
      bVar3 = bVar7;
      goto LAB_00143982;
    }
    goto LAB_001439f4;
  }
  goto LAB_00143982;
}

Assistant:

static int parsenetrc(const char *host,
                      char **loginp,
                      char **passwordp,
                      char *netrcfile)
{
  FILE *file;
  int retcode = NETRC_FILE_MISSING;
  char *login = *loginp;
  char *password = *passwordp;
  bool specific_login = (login && *login != 0);
  bool login_alloc = FALSE;
  bool password_alloc = FALSE;
  enum host_lookup_state state = NOTHING;

  char state_login = 0;      /* Found a login keyword */
  char state_password = 0;   /* Found a password keyword */
  int state_our_login = TRUE;  /* With specific_login, found *our* login
                                  name (or login-less line) */

  DEBUGASSERT(netrcfile);

  file = fopen(netrcfile, FOPEN_READTEXT);
  if(file) {
    bool done = FALSE;
    struct dynbuf buf;
    Curl_dyn_init(&buf, MAX_NETRC_LINE);

    while(!done && Curl_get_line(&buf, file)) {
      char *tok;
      char *tok_end;
      bool quoted;
      char *netrcbuffer = Curl_dyn_ptr(&buf);
      if(state == MACDEF) {
        if((netrcbuffer[0] == '\n') || (netrcbuffer[0] == '\r'))
          state = NOTHING;
        else
          continue;
      }
      tok = netrcbuffer;
      while(tok) {
        while(ISBLANK(*tok))
          tok++;
        /* tok is first non-space letter */
        if(!*tok || (*tok == '#'))
          /* end of line or the rest is a comment */
          break;

        /* leading double-quote means quoted string */
        quoted = (*tok == '\"');

        tok_end = tok;
        if(!quoted) {
          while(!ISSPACE(*tok_end))
            tok_end++;
          *tok_end = 0;
        }
        else {
          bool escape = FALSE;
          bool endquote = FALSE;
          char *store = tok;
          tok_end++; /* pass the leading quote */
          while(*tok_end) {
            char s = *tok_end;
            if(escape) {
              escape = FALSE;
              switch(s) {
              case 'n':
                s = '\n';
                break;
              case 'r':
                s = '\r';
                break;
              case 't':
                s = '\t';
                break;
              }
            }
            else if(s == '\\') {
              escape = TRUE;
              tok_end++;
              continue;
            }
            else if(s == '\"') {
              tok_end++; /* pass the ending quote */
              endquote = TRUE;
              break;
            }
            *store++ = s;
            tok_end++;
          }
          *store = 0;
          if(escape || !endquote) {
            /* bad syntax, get out */
            retcode = NETRC_FAILED;
            goto out;
          }
        }

        if((login && *login) && (password && *password)) {
          done = TRUE;
          break;
        }

        switch(state) {
        case NOTHING:
          if(strcasecompare("macdef", tok)) {
            /* Define a macro. A macro is defined with the specified name; its
               contents begin with the next .netrc line and continue until a
               null line (consecutive new-line characters) is encountered. */
            state = MACDEF;
          }
          else if(strcasecompare("machine", tok)) {
            /* the next tok is the machine name, this is in itself the
               delimiter that starts the stuff entered for this machine,
               after this we need to search for 'login' and
               'password'. */
            state = HOSTFOUND;
          }
          else if(strcasecompare("default", tok)) {
            state = HOSTVALID;
            retcode = NETRC_SUCCESS; /* we did find our host */
          }
          break;
        case MACDEF:
          if(!strlen(tok)) {
            state = NOTHING;
          }
          break;
        case HOSTFOUND:
          if(strcasecompare(host, tok)) {
            /* and yes, this is our host! */
            state = HOSTVALID;
            retcode = NETRC_SUCCESS; /* we did find our host */
          }
          else
            /* not our host */
            state = NOTHING;
          break;
        case HOSTVALID:
          /* we are now parsing sub-keywords concerning "our" host */
          if(state_login) {
            if(specific_login) {
              state_our_login = !Curl_timestrcmp(login, tok);
            }
            else if(!login || Curl_timestrcmp(login, tok)) {
              if(login_alloc) {
                free(login);
                login_alloc = FALSE;
              }
              login = strdup(tok);
              if(!login) {
                retcode = NETRC_FAILED; /* allocation failed */
                goto out;
              }
              login_alloc = TRUE;
            }
            state_login = 0;
          }
          else if(state_password) {
            if((state_our_login || !specific_login)
               && (!password || Curl_timestrcmp(password, tok))) {
              if(password_alloc) {
                free(password);
                password_alloc = FALSE;
              }
              password = strdup(tok);
              if(!password) {
                retcode = NETRC_FAILED; /* allocation failed */
                goto out;
              }
              password_alloc = TRUE;
            }
            state_password = 0;
          }
          else if(strcasecompare("login", tok))
            state_login = 1;
          else if(strcasecompare("password", tok))
            state_password = 1;
          else if(strcasecompare("machine", tok)) {
            /* ok, there is machine here go => */
            state = HOSTFOUND;
            state_our_login = FALSE;
          }
          break;
        } /* switch (state) */
        tok = ++tok_end;
      }
    } /* while Curl_get_line() */

out:
    Curl_dyn_free(&buf);
    if(!retcode) {
      /* success */
      if(login_alloc) {
        if(*loginp)
          free(*loginp);
        *loginp = login;
      }
      if(password_alloc) {
        if(*passwordp)
          free(*passwordp);
        *passwordp = password;
      }
    }
    else {
      if(login_alloc)
        free(login);
      if(password_alloc)
        free(password);
    }
    fclose(file);
  }

  return retcode;
}